

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThreads.cpp
# Opt level: O2

void __thiscall
xmrig::OclThreads::OclThreads
          (OclThreads *this,vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *devices)

{
  pointer pOVar1;
  OclDevice *device;
  pointer this_00;
  
  (this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar1 = (devices->super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (devices->super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pOVar1; this_00 = this_00 + 1)
  {
    OclDevice::generate(this_00,this);
  }
  return;
}

Assistant:

xmrig::OclThreads::OclThreads(const std::vector<OclDevice> &devices)
{
    for (const auto &device : devices) {
        device.generate(*this);
    }
}